

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_to_hir.cpp
# Opt level: O3

void apply_explicit_binding
               (_mesa_glsl_parse_state *state,YYLTYPE *loc,ir_variable *var,glsl_type *type,
               ast_type_qualifier *qual)

{
  undefined1 *puVar1;
  byte bVar2;
  gl_context *pgVar3;
  bool bVar4;
  uint uVar5;
  undefined8 in_RAX;
  uint uVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint qual_binding;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  if ((undefined1  [12])((undefined1  [12])qual->flags & (undefined1  [12])0xc00) ==
      (undefined1  [12])0x0) {
    _mesa_glsl_error(loc,state,
                     "the \"binding\" qualifier only applies to uniforms and shader storage buffer objects"
                    );
    return;
  }
  bVar4 = process_qualifier_constant(state,loc,"binding",qual->binding,&local_34);
  if (!bVar4) {
    return;
  }
  pgVar3 = state->ctx;
  bVar2 = type->field_0x4;
  uVar5 = 1;
  if (bVar2 == 0x11) {
    uVar5 = glsl_type::arrays_of_arrays_size(type);
    bVar2 = type->field_0x4;
  }
  while (uVar6 = (uint)bVar2, uVar6 == 0x11) {
    type = (type->fields).array;
    bVar2 = type->field_0x4;
  }
  uVar5 = (uVar5 + local_34) - 1;
  if (uVar6 == 0xc) {
    if (uVar5 < (pgVar3->Const).MaxCombinedTextureImageUnits) {
LAB_0019b884:
      puVar1 = &(var->data).field_0x2;
      *puVar1 = *puVar1 | 0x10;
      (var->data).binding = (uint16_t)local_34;
      return;
    }
    pcVar7 = 
    "layout(binding = %d) for %d samplers exceeds the maximum number of texture image units (%u)";
  }
  else {
    if (uVar6 != 0x10) {
      iVar8 = 1;
      uVar9 = uVar6;
      while ((char)uVar9 == '\x11') {
        iVar8 = iVar8 * type->length;
        type = (type->fields).array;
        uVar9 = *(uint *)&type->field_0x4;
      }
      if ((uVar9 & 0xff) == 0xe) {
        iVar10 = 4;
      }
      else {
        iVar10 = 0;
      }
      if (iVar10 * iVar8 == 0) {
        uVar9 = state->forced_language_version;
        if (uVar9 == 0) {
          uVar9 = state->language_version;
        }
        uVar11 = 0x1a3;
        if (state->es_shader != false) {
          uVar11 = 0x135;
        }
        if (uVar11 < uVar9) {
          if (uVar6 != 0xd) {
LAB_0019b890:
            _mesa_glsl_error(loc,state,
                             "the \"binding\" qualifier only applies to uniform blocks, storage blocks, opaque variables, or arrays thereof"
                            );
            return;
          }
        }
        else if ((uVar6 != 0xd) || (state->ARB_shading_language_420pack_enable == false))
        goto LAB_0019b890;
        uVar6 = (pgVar3->Const).MaxImageUnits;
        if (0xc0 < uVar6) {
          __assert_fail("ctx->Const.MaxImageUnits <= MAX_IMAGE_UNITS",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ast_to_hir.cpp"
                        ,0xb9a,
                        "void apply_explicit_binding(struct _mesa_glsl_parse_state *, YYLTYPE *, ir_variable *, const glsl_type *, const ast_type_qualifier *)"
                       );
        }
        if (uVar5 < uVar6) goto LAB_0019b884;
        pcVar7 = "Image binding %d exceeds the maximum number of image units (%d)";
      }
      else {
        uVar5 = (pgVar3->Const).MaxAtomicBufferBindings;
        if (0x5a < uVar5) {
          __assert_fail("ctx->Const.MaxAtomicBufferBindings <= MAX_COMBINED_ATOMIC_BUFFERS",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ast_to_hir.cpp"
                        ,0xb8e,
                        "void apply_explicit_binding(struct _mesa_glsl_parse_state *, YYLTYPE *, ir_variable *, const glsl_type *, const ast_type_qualifier *)"
                       );
        }
        if (local_34 < uVar5) goto LAB_0019b884;
        pcVar7 = 
        "layout(binding = %d) exceeds the maximum number of atomic counter buffer bindings (%u)";
        uVar5 = local_34;
      }
      _mesa_glsl_error(loc,state,pcVar7,(ulong)uVar5);
      return;
    }
    uVar6 = (uint)*(undefined8 *)&qual->flags;
    if (((uVar6 >> 10 & 1) == 0) || (uVar5 < (pgVar3->Const).MaxUniformBufferBindings)) {
      if (((uVar6 >> 0xb & 1) == 0) || (uVar5 < (pgVar3->Const).MaxShaderStorageBufferBindings))
      goto LAB_0019b884;
      pcVar7 = 
      "layout(binding = %u) for %d SSBOs exceeds the maximum number of SSBO binding points (%d)";
    }
    else {
      pcVar7 = 
      "layout(binding = %u) for %d UBOs exceeds the maximum number of UBO binding points (%d)";
    }
  }
  _mesa_glsl_error(loc,state,pcVar7);
  return;
}

Assistant:

static void
apply_explicit_binding(struct _mesa_glsl_parse_state *state,
                       YYLTYPE *loc,
                       ir_variable *var,
                       const glsl_type *type,
                       const ast_type_qualifier *qual)
{
   if (!qual->flags.q.uniform && !qual->flags.q.buffer) {
      _mesa_glsl_error(loc, state,
                       "the \"binding\" qualifier only applies to uniforms and "
                       "shader storage buffer objects");
      return;
   }

   unsigned qual_binding;
   if (!process_qualifier_constant(state, loc, "binding", qual->binding,
                                   &qual_binding)) {
      return;
   }

   const struct gl_context *const ctx = state->ctx;
   unsigned elements = type->is_array() ? type->arrays_of_arrays_size() : 1;
   unsigned max_index = qual_binding + elements - 1;
   const glsl_type *base_type = type->without_array();

   if (base_type->is_interface()) {
      /* UBOs.  From page 60 of the GLSL 4.20 specification:
       * "If the binding point for any uniform block instance is less than zero,
       *  or greater than or equal to the implementation-dependent maximum
       *  number of uniform buffer bindings, a compilation error will occur.
       *  When the binding identifier is used with a uniform block instanced as
       *  an array of size N, all elements of the array from binding through
       *  binding + N – 1 must be within this range."
       *
       * The implementation-dependent maximum is GL_MAX_UNIFORM_BUFFER_BINDINGS.
       */
      if (qual->flags.q.uniform &&
         max_index >= ctx->Const.MaxUniformBufferBindings) {
         _mesa_glsl_error(loc, state, "layout(binding = %u) for %d UBOs exceeds "
                          "the maximum number of UBO binding points (%d)",
                          qual_binding, elements,
                          ctx->Const.MaxUniformBufferBindings);
         return;
      }

      /* SSBOs. From page 67 of the GLSL 4.30 specification:
       * "If the binding point for any uniform or shader storage block instance
       *  is less than zero, or greater than or equal to the
       *  implementation-dependent maximum number of uniform buffer bindings, a
       *  compile-time error will occur. When the binding identifier is used
       *  with a uniform or shader storage block instanced as an array of size
       *  N, all elements of the array from binding through binding + N – 1 must
       *  be within this range."
       */
      if (qual->flags.q.buffer &&
         max_index >= ctx->Const.MaxShaderStorageBufferBindings) {
         _mesa_glsl_error(loc, state, "layout(binding = %u) for %d SSBOs exceeds "
                          "the maximum number of SSBO binding points (%d)",
                          qual_binding, elements,
                          ctx->Const.MaxShaderStorageBufferBindings);
         return;
      }
   } else if (base_type->is_sampler()) {
      /* Samplers.  From page 63 of the GLSL 4.20 specification:
       * "If the binding is less than zero, or greater than or equal to the
       *  implementation-dependent maximum supported number of units, a
       *  compilation error will occur. When the binding identifier is used
       *  with an array of size N, all elements of the array from binding
       *  through binding + N - 1 must be within this range."
       */
      unsigned limit = ctx->Const.MaxCombinedTextureImageUnits;

      if (max_index >= limit) {
         _mesa_glsl_error(loc, state, "layout(binding = %d) for %d samplers "
                          "exceeds the maximum number of texture image units "
                          "(%u)", qual_binding, elements, limit);

         return;
      }
   } else if (base_type->contains_atomic()) {
      assert(ctx->Const.MaxAtomicBufferBindings <= MAX_COMBINED_ATOMIC_BUFFERS);
      if (qual_binding >= ctx->Const.MaxAtomicBufferBindings) {
         _mesa_glsl_error(loc, state, "layout(binding = %d) exceeds the "
                          "maximum number of atomic counter buffer bindings "
                          "(%u)", qual_binding,
                          ctx->Const.MaxAtomicBufferBindings);

         return;
      }
   } else if ((state->is_version(420, 310) ||
               state->ARB_shading_language_420pack_enable) &&
              base_type->is_image()) {
      assert(ctx->Const.MaxImageUnits <= MAX_IMAGE_UNITS);
      if (max_index >= ctx->Const.MaxImageUnits) {
         _mesa_glsl_error(loc, state, "Image binding %d exceeds the "
                          "maximum number of image units (%d)", max_index,
                          ctx->Const.MaxImageUnits);
         return;
      }

   } else {
      _mesa_glsl_error(loc, state,
                       "the \"binding\" qualifier only applies to uniform "
                       "blocks, storage blocks, opaque variables, or arrays "
                       "thereof");
      return;
   }

   var->data.explicit_binding = true;
   var->data.binding = qual_binding;

   return;
}